

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

void __thiscall
BackwardPass::SetWriteThroughSymbolsSetForRegion
          (BackwardPass *this,BasicBlock *catchOrFinallyBlock,Region *tryRegion)

{
  Type TVar1;
  Type pJVar2;
  Region *pRVar3;
  long lVar4;
  code *pcVar5;
  bool bVar6;
  BOOLEAN BVar7;
  BVSparse<Memory::JitArenaAllocator> *pBVar8;
  undefined4 *puVar9;
  BVSparse<Memory::JitArenaAllocator> *pBVar10;
  Type_conflict pBVar11;
  ulong uVar12;
  ulong uVar13;
  
  pBVar8 = (BVSparse<Memory::JitArenaAllocator> *)
           new<Memory::JitArenaAllocator>(0x20,this->func->m_alloc,0x3f1274);
  pJVar2 = this->func->m_alloc;
  pBVar8->head = (Type_conflict)0x0;
  pBVar8->lastFoundIndex = (Type_conflict)0x0;
  pBVar8->alloc = pJVar2;
  pBVar8->lastUsedNodePrevNextField = (Type)pBVar8;
  tryRegion->writeThroughSymbolsSet = pBVar8;
  bVar6 = DoByteCodeUpwardExposedUsed(this);
  if (bVar6) {
    if (catchOrFinallyBlock->byteCodeUpwardExposedUsed == (BVSparse<Memory::JitArenaAllocator> *)0x0
       ) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x228b,"(catchOrFinallyBlock->byteCodeUpwardExposedUsed)",
                         "catchOrFinallyBlock->byteCodeUpwardExposedUsed");
      if (!bVar6) goto LAB_003ea803;
      *puVar9 = 0;
    }
    pBVar8 = catchOrFinallyBlock->byteCodeUpwardExposedUsed;
    pBVar10 = pBVar8;
    do {
      pBVar10 = (BVSparse<Memory::JitArenaAllocator> *)pBVar10->head;
      if (pBVar10 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_003ea6c0;
    } while (((Type *)&pBVar10->alloc)->word == 0);
    if (pBVar10 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      while (pBVar8 = (BVSparse<Memory::JitArenaAllocator> *)pBVar8->head,
            pBVar8 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        uVar12 = ((Type *)&pBVar8->alloc)->word;
        if (uVar12 != 0) {
          TVar1 = *(Type *)&pBVar8->lastFoundIndex;
          uVar13 = 0;
          if (uVar12 != 0) {
            for (; (uVar12 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
            }
          }
          do {
            BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar13);
            uVar12 = uVar12 & ~(1L << (uVar13 & 0x3f));
            BVSparse<Memory::JitArenaAllocator>::Set
                      (tryRegion->writeThroughSymbolsSet,(BVIndex)uVar13 + TVar1);
            lVar4 = 0;
            if (uVar12 != 0) {
              for (; (uVar12 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
              }
            }
            uVar13 = (ulong)(-(uint)(uVar12 == 0) | (uint)lVar4);
          } while (uVar12 != 0);
        }
      }
    }
LAB_003ea6c0:
    pRVar3 = tryRegion->parent;
    if (pRVar3->type == RegionTypeTry) {
      if (pRVar3->writeThroughSymbolsSet == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x22a8,"(parentTry->writeThroughSymbolsSet)",
                           "parentTry->writeThroughSymbolsSet");
        if (!bVar6) {
LAB_003ea803:
          pcVar5 = (code *)invalidInstructionException();
          (*pcVar5)();
        }
        *puVar9 = 0;
      }
      pBVar11 = pRVar3->writeThroughSymbolsSet->head;
      if (pBVar11 != (Type_conflict)0x0) {
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        do {
          uVar12 = (pBVar11->data).word;
          if (uVar12 != 0) {
            TVar1 = pBVar11->startIndex;
            uVar13 = 0;
            if (uVar12 != 0) {
              for (; (uVar12 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
              }
            }
            do {
              BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar13);
              BVar7 = BVSparse<Memory::JitArenaAllocator>::Test
                                (tryRegion->writeThroughSymbolsSet,(BVIndex)uVar13 + TVar1);
              if (BVar7 == '\0') {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar9 = 1;
                bVar6 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                   ,0x22ab,"(tryRegion->writeThroughSymbolsSet->Test(id))",
                                   "tryRegion->writeThroughSymbolsSet->Test(id)");
                if (!bVar6) goto LAB_003ea803;
                *puVar9 = 0;
              }
              uVar12 = uVar12 & ~(1L << (uVar13 & 0x3f));
              lVar4 = 0;
              if (uVar12 != 0) {
                for (; (uVar12 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
                }
              }
              uVar13 = (ulong)(-(uint)(uVar12 == 0) | (uint)lVar4);
            } while (uVar12 != 0);
          }
          pBVar11 = pBVar11->next;
        } while (pBVar11 != (Type)0x0);
      }
    }
  }
  return;
}

Assistant:

void
BackwardPass::SetWriteThroughSymbolsSetForRegion(BasicBlock * catchOrFinallyBlock, Region * tryRegion)
{
    tryRegion->writeThroughSymbolsSet = JitAnew(this->func->m_alloc, BVSparse<JitArenaAllocator>, this->func->m_alloc);

    if (this->DoByteCodeUpwardExposedUsed())
    {
        Assert(catchOrFinallyBlock->byteCodeUpwardExposedUsed);
        if (!catchOrFinallyBlock->byteCodeUpwardExposedUsed->IsEmpty())
        {
            FOREACH_BITSET_IN_SPARSEBV(id, catchOrFinallyBlock->byteCodeUpwardExposedUsed)
            {
                tryRegion->writeThroughSymbolsSet->Set(id);
            }
            NEXT_BITSET_IN_SPARSEBV
        }
#if DBG
        // Symbols write-through in the parent try region should be marked as write-through in the current try region as well.
        // x =
        // try{
        //      try{
        //          x =         <-- x needs to be write-through here. With the current mechanism of not clearing a write-through
        //                          symbol from the bytecode upward-exposed on a def, x should be marked as write-through as
        //                          write-through symbols for a try are basically the bytecode upward exposed symbols at the
        //                          beginning of the corresponding catch block).
        //                          Verify that it still holds.
        //          <exception>
        //      }
        //      catch(){}
        //      x =
        // }
        // catch(){}
        // = x
        if (tryRegion->GetParent()->GetType() == RegionTypeTry)
        {
            Region * parentTry = tryRegion->GetParent();
            Assert(parentTry->writeThroughSymbolsSet);
            FOREACH_BITSET_IN_SPARSEBV(id, parentTry->writeThroughSymbolsSet)
            {
                Assert(tryRegion->writeThroughSymbolsSet->Test(id));
            }
            NEXT_BITSET_IN_SPARSEBV
        }
#endif
    }
    else
    {
        // this can happen with -off:globopt
        return;
    }
}